

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_Test2DTileYResourceArrays_Test::TestBody
          (CTestResource_Test2DTileYResourceArrays_Test *this)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint ExpectedValue;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  int iVar5;
  uint32_t PitchInBytes;
  uint32_t AlignedWidth;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint32_t BlockHeight;
  uint32_t AlignedHeight;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileHeight;
  uint32_t TileWidth;
  uint32_t VAlign;
  uint32_t HAlign;
  CTestResource_Test2DTileYResourceArrays_Test *this_local;
  
  gmmParams.MultiTileArch.Reserved = 0x80;
  gmmParams.MultiTileArch._0_1_ = 0x20;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\0';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_32;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffefffffffff | 0x1000000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  gmmParams.Depth = 4;
  for (AlignedHeight = 0; AlignedHeight < 5; AlignedHeight = AlignedHeight + 1) {
    i = CTestResource::SetResourceFormat(&this->super_CTestResource,AlignedHeight);
    uVar1 = CTestResource::GetBppValue(&this->super_CTestResource,AlignedHeight);
    gmmParams._40_8_ = ZEXT48((int)(0x80 / (ulong)uVar1) + 1);
    gmmParams.field_6.BaseWidth = 0x21;
    iVar2 = gmmParams.Depth * 0x24;
    iVar5 = gmmParams.Depth * 0x24;
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&bpp);
    uVar1 = gmmParams.CpTag;
    uVar3 = CTestResource::GetBppValue(&this->super_CTestResource,AlignedHeight);
    iVar4 = ((uVar1 + 0xf) - (uVar1 + 0xf & 0xf)) * uVar3;
    ExpectedValue = (iVar4 + 0x7f) - (iVar4 + 0x7fU & 0x7f);
    CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,ResourceInfo_00,0x10);
    CTestResource::VerifyResourceVAlign<true>(&this->super_CTestResource,ResourceInfo_00,4);
    CTestResource::VerifyResourcePitch<true>
              (&this->super_CTestResource,ResourceInfo_00,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>
              (&this->super_CTestResource,ResourceInfo_00,ExpectedValue >> 7);
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,ResourceInfo_00,
               (ulong)(ExpectedValue * (iVar2 + (0x1f - (iVar5 + 0x1fU & 0x1f)))));
    CTestResource::VerifyResourceQPitch<true>(&this->super_CTestResource,ResourceInfo_00,0x24);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  }
  return;
}

Assistant:

TEST_F(CTestResource, Test2DTileYResourceArrays)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign = 16;
    const uint32_t VAlign = 4;

    const uint32_t TileWidth  = 128;
    const uint32_t TileHeight = 32;

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileWidth / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileHeight + 1;                     // 1 row larger than 1 tile height
        uint32_t AlignedHeight, BlockHeight;

        BlockHeight   = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
        AlignedHeight = GMM_ULT_ALIGN_NP2(BlockHeight * gmmParams.ArraySize, TileHeight);

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        const uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign);
        uint32_t       PitchInBytes = AlignedWidth * GetBppValue(bpp);
        PitchInBytes                = GMM_ULT_ALIGN(PitchInBytes, TileWidth);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, PitchInBytes);
        VerifyResourcePitchInTiles<true>(ResourceInfo, PitchInBytes / TileWidth);
        VerifyResourceSize<true>(ResourceInfo, PitchInBytes * AlignedHeight); // 4 tile big x 4 array size
        VerifyResourceQPitch<true>(ResourceInfo, BlockHeight);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}